

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceGLImpl.cpp
# Opt level: O1

Uint64 __thiscall Diligent::FenceGLImpl::GetCompletedValue(FenceGLImpl *this)

{
  atomic<unsigned_long> *paVar1;
  _Elt_pointer ppVar2;
  ulong uVar3;
  GLenum GVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  value_type *val_fence;
  bool bVar8;
  
  while ((ppVar2 = (this->m_PendingFences).
                   super__Deque_base<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::allocator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur,
         (this->m_PendingFences).
         super__Deque_base<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::allocator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar2 &&
         (GVar4 = (*__glewClientWaitSync)((ppVar2->second).SyncHandle,0,0), GVar4 == 0x911a))) {
    uVar3 = ppVar2->first;
    uVar5 = (this->super_FenceBase<Diligent::EngineGLImplTraits>).m_LastCompletedFenceValue.
            super___atomic_base<unsigned_long>._M_i;
    do {
      uVar7 = uVar3;
      if (uVar3 < uVar5) {
        uVar7 = uVar5;
      }
      paVar1 = &(this->super_FenceBase<Diligent::EngineGLImplTraits>).m_LastCompletedFenceValue;
      LOCK();
      uVar6 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
      bVar8 = uVar5 == uVar6;
      if (bVar8) {
        (paVar1->super___atomic_base<unsigned_long>)._M_i = uVar7;
        uVar6 = uVar5;
      }
      UNLOCK();
      uVar5 = uVar6;
    } while (!bVar8);
    std::
    deque<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::allocator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_>_>
    ::pop_front(&this->m_PendingFences);
  }
  return (this->super_FenceBase<Diligent::EngineGLImplTraits>).m_LastCompletedFenceValue.
         super___atomic_base<unsigned_long>._M_i;
}

Assistant:

Uint64 FenceGLImpl::GetCompletedValue()
{
    while (!m_PendingFences.empty())
    {
        auto& val_fence = m_PendingFences.front();

        auto res =
            glClientWaitSync(val_fence.second,
                             0, // Can be SYNC_FLUSH_COMMANDS_BIT
                             0  // Timeout in nanoseconds
            );
        if (res == GL_ALREADY_SIGNALED)
        {
            UpdateLastCompletedFenceValue(val_fence.first);
            m_PendingFences.pop_front();
        }
        else
        {
            break;
        }
    }

    return m_LastCompletedFenceValue.load();
}